

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipp.hpp
# Opt level: O0

doc_formatting * __thiscall clipp::doc_formatting::last_column(doc_formatting *this,int col)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int in_ESI;
  doc_formatting *in_RDI;
  
  iVar2 = in_ESI;
  iVar1 = first_column(in_RDI);
  if (in_ESI < iVar1) {
    iVar2 = first_column(in_RDI);
  }
  iVar1 = iVar2;
  iVar3 = doc_column(in_RDI);
  if (iVar2 < iVar3) {
    doc_column((doc_formatting *)CONCAT44(iVar1,in_ESI),(int)((ulong)in_RDI >> 0x20));
  }
  in_RDI->lastCol_ = iVar1;
  return in_RDI;
}

Assistant:

doc_formatting&
    last_column(int col) {
        //limit to [first_column,oo] but push doc_column to the left if necessary
        if(col < first_column()) col = first_column();
        if(col < doc_column()) doc_column(col);
        lastCol_ = col;
        return *this;
    }